

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O1

void (anonymous_namespace)::
     roundtrip_into<std::__cxx11::list<int,std::allocator<int>>,std::__cxx11::list<int,std::allocator<int>>>
               (list<int,_std::allocator<int>_> *in,list<int,_std::allocator<int>_> *out)

{
  undefined4 uVar1;
  long lVar2;
  _List_node_base *p_Var3;
  Result *in_R9;
  const_iterator __end0;
  uint32_t size;
  InputStream istream;
  OutputStream ostream;
  stringstream stream;
  undefined1 auStack_1f8 [4];
  ExpressionDecomposer local_1f4;
  ulong local_1f0;
  Expression_lhs<unsigned_long> local_1e8;
  stringstream *local_1d8;
  Result local_1d0;
  long local_1b0 [2];
  char local_1a0 [12];
  undefined4 auStack_194 [25];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  lVar2 = *(long *)(local_1b0[0] + -0x18);
  *(undefined4 *)((long)auStack_194 + lVar2) = 4;
  std::ios::clear((int)auStack_1f8 + (int)lVar2 + 0x48);
  uVar1 = (undefined4)(in->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size;
  local_1e8.lhs = CONCAT44(local_1e8.lhs._4_4_,uVar1);
  local_1d8 = (stringstream *)local_1b0;
  std::ostream::write(local_1a0,(long)&local_1e8);
  mserialize::detail::BuiltinSerializer<std::__cxx11::list<int,_std::allocator<int>_>,_void>::
  serialize_elems<OutputStream>(in,uVar1,&local_1d8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1f4,DT_CHECK);
  local_1e8.lhs = std::ostream::tellp();
  local_1e8.m_at = local_1f4.m_at;
  local_1f0 = 0;
  p_Var3 = (_List_node_base *)in;
  do {
    p_Var3 = (((_List_base<int,_std::allocator<int>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    local_1f0 = local_1f0 + 4;
  } while (p_Var3 != (_List_node_base *)in);
  doctest::detail::Expression_lhs<unsigned_long>::operator==(&local_1d0,&local_1e8,&local_1f0);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x1b728c,(char *)0x36,0x1b74f4,&local_1d0.m_passed,in_R9);
  doctest::String::~String(&local_1d0.m_decomp);
  local_1e8.lhs = (unsigned_long)local_1b0;
  std::istream::read((char *)local_1b0,(long)&local_1f0);
  mserialize::detail::BuiltinDeserializer<std::__cxx11::list<int,_std::allocator<int>_>,_void>::
  deserialize_elems<InputStream>(out,local_1f0 & 0xffffffff,&local_1e8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void roundtrip_into(const In& in, Out& out)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // make sure computed serialized size is correct
  CHECK(std::size_t(stream.tellp()) == mserialize::serialized_size(in));

  // deserialize
  InputStream istream{stream};
  mserialize::deserialize(out, istream);
}